

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O1

ssl_hs_wait_t bssl::ssl_client_handshake(SSL_HANDSHAKE *hs)

{
  InplaceVector<unsigned_char,_32UL> *__src;
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_buf_mem_st_*,_false> _Var3;
  EVP_PKEY *pkey;
  DTLS1_STATE *ssl;
  _Head_base<0UL,_ssl_session_st_*,_false> session;
  ssl_session_st *psVar4;
  _func_3149 *p_Var5;
  CERT *pCVar6;
  _func_int_SSL_ptr_void_ptr *p_Var7;
  SSL_CONFIG *pSVar8;
  SSL_SESSION *session_00;
  SSL_CREDENTIAL *cred;
  SSL *ssl_00;
  _func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> premaster;
  pointer __p_00;
  Span<const_unsigned_char> signature;
  undefined1 auVar13 [8];
  _Head_base<0UL,_ssl_ctx_st_*,_false> ssl_01;
  UniquePtr<SSL_SESSION> *this;
  size_t sVar14;
  bool bVar15;
  undefined1 uVar16;
  char cVar17;
  bool bVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  int iVar21;
  ssl_private_key_result_t sVar22;
  ssl_verify_result_t sVar23;
  ssl_hs_wait_t sVar24;
  int iVar25;
  uint32_t uVar26;
  uint uVar27;
  uint uVar28;
  SSLSessionType SVar29;
  CRYPTO_BUFFER *pCVar30;
  char *__p_01;
  size_t sVar31;
  RSA *rsa;
  undefined1 *puVar32;
  uchar *puVar33;
  ulong uVar34;
  SSL_CIPHER *pSVar35;
  OPENSSL_STACK *sk;
  ushort uVar36;
  undefined2 uVar37;
  SSL_SESSION *extraout_RDX;
  SSL_SESSION *extraout_RDX_00;
  SSL_SESSION *extraout_RDX_01;
  SSL_SESSION *pSVar38;
  pointer __p_3;
  SSL *pSVar39;
  SSL *pSVar40;
  SSL_SESSION *in_R8;
  SSL_SESSION *in_R9;
  ptrdiff_t _Num;
  pointer psVar41;
  pointer __p;
  undefined4 uVar42;
  pointer __p_1;
  Array<unsigned_char> *this_00;
  initializer_list<bssl::SSLExtension_*> extensions;
  Span<const_unsigned_char> protocol;
  Span<unsigned_char> out;
  Span<unsigned_char> out_enc;
  Span<const_unsigned_char> enc;
  Span<const_unsigned_char> protocol_00;
  size_t sig_len;
  uint16_t signature_algorithm;
  CBB child;
  char *raw;
  uint8_t *ptr;
  CBB body;
  uint8_t ech_enc [65];
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  CRYPTO_EX_DATA in_stack_fffffffffffffcf0;
  Array<unsigned_char> local_2f8;
  CBS local_2e8;
  undefined1 local_2d8 [8];
  undefined1 auStack_2d0 [40];
  SSL3_STATE *local_2a8;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_2a0;
  undefined1 local_298 [48];
  undefined1 local_268 [8];
  CRYPTO_EX_DATA CStack_260;
  Array<unsigned_char> *local_238;
  InplaceVector<unsigned_char,_32UL> *local_230;
  UniquePtr<SSL_SESSION> *local_228;
  uint16_t *local_220;
  undefined1 local_218 [136];
  Array<unsigned_char> *local_190;
  _Head_base<0UL,_char_*,_false> local_188;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_180;
  undefined1 local_178 [48];
  size_t local_148;
  uint16_t local_140;
  uint8_t local_13e;
  CBS local_138 [12];
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *local_78;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_70;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_68;
  UniquePtr<SSLKeyShare> *local_60;
  uint8_t *local_58;
  UniquePtr<EVP_PKEY> *local_50;
  SSL_SESSION *local_48;
  UniquePtr<SSL_SESSION> *local_40;
  uint16_t *local_38;
  
  local_228 = &hs->new_session;
  local_2a8 = (SSL3_STATE *)&hs->transcript;
  local_238 = &hs->peer_key;
  local_180._M_head_impl = (stack_st_CRYPTO_BUFFER *)&hs->credential;
  local_190 = &hs->certificate_types;
  local_78 = &hs->ca_names;
  local_70._M_head_impl = (crypto_buffer_st *)&hs->peer_psk_identity_hint;
  local_50 = &hs->peer_pubkey;
  local_188._M_head_impl = (char *)&hs->dtls_cookie;
  local_60 = hs->key_shares;
  local_68._M_head_impl = (crypto_buffer_st *)(hs->key_shares + 1);
  local_230 = &hs->session_id;
  local_48 = (SSL_SESSION *)&hs->early_traffic_secret;
  local_40 = &hs->early_session;
  local_38 = &hs->min_version;
  local_220 = &hs->max_version;
  local_58 = hs->inner_client_random;
  do {
    iVar2 = hs->state;
    sVar24 = ssl_hs_error;
    switch(iVar2) {
    case 0:
      pSVar40 = hs->ssl;
      ssl_do_info_callback(pSVar40,0x10,1);
      puVar32 = &pSVar40->s3->field_0xdc;
      *(ushort *)puVar32 = *(ushort *)puVar32 & 0xffdf;
      bVar15 = ssl_get_version_range(hs,local_38,local_220);
      sVar24 = ssl_hs_error;
      if (bVar15) {
        out_enc.size_ = (size_t)local_2d8;
        out_enc.data_ = (uchar *)0x41;
        bVar15 = ssl_select_ech_config
                           ((bssl *)hs,(SSL_HANDSHAKE *)local_178,out_enc,(size_t *)in_R8);
        sVar24 = ssl_hs_error;
        if (bVar15) {
          iVar25 = SSL_is_dtls(hs->ssl);
          uVar36 = hs->max_version;
          if (iVar25 == 0) {
            if (0x302 < uVar36) {
              uVar36 = 0x303;
            }
          }
          else {
            uVar36 = (ushort)(uVar36 < 0x303) * 2 | 0xfefd;
          }
          hs->client_version = uVar36;
          bVar15 = ssl_setup_pake_shares(hs);
          if (bVar15) {
            pSVar38 = (pSVar40->session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            sVar24 = ssl_hs_error;
            SVar29 = kNotResumable;
            if (pSVar38 != (SSL_SESSION *)0x0) {
              SVar29 = ssl_session_get_type(pSVar38);
              psVar4 = (pSVar40->session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              if (((psVar4->field_0x1b8 & 0x10) == 0) &&
                 (bVar15 = ssl_supports_version(hs,psVar4->ssl_version), bVar15)) {
                if ((hs->selected_ech_config)._M_t.
                    super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0
                   ) {
                  pSVar38 = extraout_RDX;
                  if (SVar29 != kNotResumable) goto LAB_00147f4a;
                }
                else {
                  uVar19 = ssl_session_protocol_version
                                     ((pSVar40->session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
                  if ((SVar29 != kNotResumable) && (pSVar38 = extraout_RDX_00, 0x303 < uVar19)) {
LAB_00147f4a:
                    if (((SVar29 != kTicket) ||
                        (uVar26 = SSL_get_options(pSVar40), pSVar38 = extraout_RDX_01,
                        (uVar26 >> 0xe & 1) == 0)) &&
                       (((((hs->pake_prover)._M_t.
                           super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>.
                           _M_t.
                           super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                           (Prover *)0x0 &&
                          (bVar15 = ssl_session_is_time_valid
                                              ((bssl *)pSVar40,
                                               (SSL *)(pSVar40->session)._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl,pSVar38), bVar15)) &&
                         (uVar28 = SSL_is_quic(pSVar40),
                         uVar28 == ((*(uint *)&((pSVar40->session)._M_t.
                                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl)->field_0x1b8 >> 5 & 1) != 0))) &&
                        ((pSVar40->s3->field_0xdc & 0x10) == 0)))) goto LAB_00147fab;
                  }
                }
              }
              SVar29 = kNotResumable;
              ssl_set_session(pSVar40,(SSL_SESSION *)0x0);
            }
LAB_00147fab:
            iVar25 = RAND_bytes(pSVar40->s3->client_random,0x20);
            if ((iVar25 != 0) &&
               (((hs->selected_ech_config)._M_t.
                 super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0 ||
                (iVar25 = RAND_bytes(local_58,0x20), iVar25 != 0)))) {
              if ((*local_220 < 0x304) || (iVar25 = SSL_is_quic(pSVar40), iVar25 != 0)) {
                bVar15 = false;
              }
              else {
                iVar25 = SSL_is_dtls(pSVar40);
                bVar15 = iVar25 == 0;
              }
              if (SVar29 == kTicket) {
LAB_00148060:
                (hs->session_id).size_ = ' ';
                iVar25 = RAND_bytes((uchar *)local_230,0x20);
                if (iVar25 == 0) goto LAB_00147cf9;
              }
              else if (SVar29 == kID) {
                psVar4 = (pSVar40->session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                __src = &psVar4->session_id;
                if (local_230 != __src) {
                  bVar1 = (psVar4->session_id).size_;
                  if (0x20 < (ulong)bVar1) goto LAB_00148bba;
                  (hs->session_id).size_ = '\0';
                  if (bVar1 != 0) {
                    memmove(local_230,__src,(ulong)bVar1);
                  }
                  (hs->session_id).size_ = bVar1;
                }
              }
              else if (bVar15) goto LAB_00148060;
              ssl_00 = hs->ssl;
              if ((ssl_00->field_0xa4 & 1) != 0) {
                __assert_fail("!ssl->server",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x126,
                              "ssl_early_data_reason_t bssl::should_offer_early_data(const SSL_HANDSHAKE *)"
                             );
              }
              if ((ssl_00->field_0xa4 & 4) == 0) {
                sVar31 = 1;
LAB_001480b2:
                bVar15 = false;
              }
              else {
                sVar31 = 3;
                if (*local_220 < 0x304) goto LAB_001480b2;
                iVar25 = SSL_is_dtls(ssl_00);
                if (iVar25 == 0) {
                  pSVar38 = (ssl_00->session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  if (pSVar38 == (SSL_SESSION *)0x0) {
                    sVar31 = 5;
                  }
                  else {
                    uVar19 = ssl_session_protocol_version(pSVar38);
                    sVar31 = 7;
                    if ((0x303 < uVar19) &&
                       (psVar4 = (ssl_00->session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                       psVar4->ticket_max_early_data != 0)) {
                      puVar33 = (uchar *)(psVar4->early_alpn).size_;
                      sVar31 = 2;
                      bVar15 = true;
                      if (puVar33 == (uchar *)0x0) goto LAB_001480b5;
                      protocol_00.size_ = 2;
                      protocol_00.data_ = puVar33;
                      bVar18 = ssl_is_alpn_protocol_allowed
                                         ((bssl *)hs,(SSL_HANDSHAKE *)(psVar4->early_alpn).data_,
                                          protocol_00);
                      if (bVar18) {
                        psVar4 = (ssl_00->session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                        if ((psVar4->field_0x1b8 & 0x40) != 0) {
                          local_218._0_8_ = (SSL_CONFIG *)0x0;
                          local_218._8_8_ = (pointer)0x0;
                          protocol.size_ = (size_t)in_R8;
                          protocol.data_ = (uchar *)(psVar4->early_alpn).size_;
                          bVar18 = ssl_get_local_application_settings
                                             ((bssl *)hs,(SSL_HANDSHAKE *)local_218,
                                              (Span<const_unsigned_char> *)
                                              (psVar4->early_alpn).data_,protocol);
                          if (((!bVar18) ||
                              (psVar4 = (ssl_00->session)._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                              , (pointer)local_218._8_8_ !=
                                (pointer)(psVar4->local_application_settings).size_)) ||
                             (((pointer)local_218._8_8_ != (pointer)0x0 &&
                              (iVar25 = bcmp((void *)local_218._0_8_,
                                             (psVar4->local_application_settings).data_,
                                             local_218._8_8_), iVar25 != 0)))) {
                            sVar31 = 0xe;
                            goto LAB_001480b2;
                          }
                        }
                        sVar31 = 2;
                        goto LAB_001480b5;
                      }
                      sVar31 = 9;
                    }
                  }
                  goto LAB_001480b2;
                }
                bVar15 = false;
                sVar31 = 3;
              }
LAB_001480b5:
              if (bVar15) {
                hs->field_0x6c9 = hs->field_0x6c9 | 8;
              }
              else {
                pSVar40->s3->early_data_reason = (ssl_early_data_reason_t)sVar31;
              }
              sVar24 = ssl_hs_error;
              bVar15 = ssl_setup_key_shares(hs,0);
              if ((((bVar15) && (bVar15 = ssl_setup_extension_permutation(hs), bVar15)) &&
                  (enc.size_ = sVar31, enc.data_ = (uchar *)local_2d8,
                  bVar15 = ssl_encrypt_client_hello((bssl *)hs,(SSL_HANDSHAKE *)local_178,enc),
                  bVar15)) && (bVar15 = ssl_add_client_hello(hs), bVar15)) {
                hs->state = 1;
                goto LAB_00145ff0;
              }
            }
          }
        }
      }
      break;
    case 1:
      if ((hs->field_0x6c9 & 8) == 0) {
        hs->state = 3;
      }
      else {
        pSVar40 = hs->ssl;
        session._M_head_impl =
             (pSVar40->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        if (session._M_head_impl != (SSL_SESSION *)0x0) {
          SSL_SESSION_up_ref(session._M_head_impl);
        }
        local_178._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_40,
                   session._M_head_impl);
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_178);
        pSVar40->s3->version =
             ((hs->early_session)._M_t.
              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version;
        hs->field_0x6c9 = hs->field_0x6c9 | 0x40;
        hs->state = 2;
      }
      goto LAB_001466e3;
    case 2:
      pSVar40 = hs->ssl;
      if (((pSVar40->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == true) {
        sVar24 = ssl_hs_error;
        sVar23 = ssl_reverify_peer_cert(hs,false);
        if (sVar23 != ssl_verify_invalid) {
          if (sVar23 != ssl_verify_retry) goto LAB_001465af;
          hs->state = 2;
          sVar24 = ssl_hs_certificate_verify;
        }
      }
      else {
LAB_001465af:
        bVar15 = (*pSVar40->method->add_change_cipher_spec)(pSVar40);
        sVar24 = ssl_hs_error;
        if (bVar15) {
          bVar15 = tls13_init_early_key_schedule
                             (hs,(hs->early_session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
          sVar24 = ssl_hs_error;
          if (bVar15) {
            bVar15 = tls13_derive_early_secret(hs);
            sVar24 = ssl_hs_error;
            if (bVar15) {
              in_R9 = (SSL_SESSION *)(ulong)(hs->early_traffic_secret).size_;
              traffic_secret.data_._4_4_ = in_stack_fffffffffffffcec;
              traffic_secret.data_._0_4_ = in_stack_fffffffffffffce8;
              traffic_secret.size_ = (size_t)in_stack_fffffffffffffcf0.sk;
              in_R8 = local_48;
              bVar15 = tls13_set_traffic_key
                                 ((bssl *)hs->ssl,(SSL *)0x1,ssl_encryption_early_data,
                                  (evp_aead_direction_t)
                                  (hs->early_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  local_48,traffic_secret);
              sVar24 = ssl_hs_error;
              if (bVar15) {
                hs->field_0x6c9 = hs->field_0x6c9 | 0x24;
                hs->state = 3;
                goto LAB_00146642;
              }
            }
          }
        }
      }
      break;
    case 3:
      pSVar39 = (SSL *)hs->ssl;
      cVar17 = (**(code **)(*(long *)pSVar39 + 0x18))(pSVar39);
      sVar24 = ssl_hs_read_server_hello;
      if (cVar17 != '\0') {
        iVar25 = SSL_is_dtls((SSL *)pSVar39);
        if (((iVar25 == 0) || ((hs->field_0x6cb & 2) != 0)) || (local_218[1] != '\x03')) {
          local_178._16_2_ = ssl_hs_error;
          local_140 = 0;
          local_13e = '\0';
          local_2e8.data._0_1_ = 0x32;
          bVar15 = ssl_parse_server_hello
                             ((ParsedServerHello *)local_178,(uint8_t *)&local_2e8,
                              (SSLMessage *)local_218);
          if (!bVar15) {
LAB_00146c1a:
            uVar28 = (uint)(byte)local_2e8.data;
            goto LAB_001472a1;
          }
          iVar25 = SSL_is_dtls(hs->ssl);
          uVar37 = 0xfefd;
          if (iVar25 == 0) {
            uVar37 = 0x303;
          }
          if (uVar37 == local_178._16_2_) {
            local_2d8._0_4_ = 0x1002b;
            auStack_2d0._0_8_ = (__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>)0x0;
            auStack_2d0._8_8_ = (uint8_t *)0x0;
            local_298[0] = SUB81(local_138[0].data,0);
            local_298[1] = (char)((ulong)local_138[0].data >> 8);
            local_298._2_6_ = (undefined6)((ulong)local_138[0].data >> 0x10);
            local_298._8_8_ = local_138[0].len;
            local_268 = (undefined1  [8])local_2d8;
            extensions._M_len = 1;
            extensions._M_array = (iterator)0x1;
            in_R8 = (SSL_SESSION *)0x1;
            bVar15 = ssl_parse_extensions
                               ((bssl *)local_298,&local_2e8,local_268,extensions,SUB81(in_R9,0));
            if (!bVar15) goto LAB_00146c1a;
            if (local_2d8[3] == '\0') {
              local_2f8.data_._0_2_ = local_178._16_2_;
            }
            else {
              iVar25 = CBS_get_u16((CBS *)auStack_2d0,(uint16_t *)&local_2f8);
              if ((iVar25 == 0) || ((uint8_t *)auStack_2d0._8_8_ != (uint8_t *)0x0)) {
                local_2e8.data._0_1_ = 0x32;
                goto LAB_00146c1a;
              }
            }
          }
          else {
            local_2f8.data_._0_2_ = local_178._16_2_;
          }
          bVar15 = ssl_supports_version(hs,local_2f8.data_._0_2_);
          if (bVar15) {
            p_Var5 = pSVar39->handshake_func;
            if (((byte)p_Var5[0xdc] & 0x10) == 0) {
              if ((*(uint16_t *)(p_Var5 + 0xd0) != 0) &&
                 (((hs->field_0x6c9 & 0x40) == 0 ||
                  (*(uint16_t *)(p_Var5 + 0xd0) !=
                   ((hs->early_session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version)))) {
                __assert_fail("ssl->s3->version == 0 || (hs->is_early_version && ssl->s3->version == hs->early_session->ssl_version)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x262,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              *(undefined2 *)(p_Var5 + 0xd0) = local_2f8.data_._0_2_;
              hs->field_0x6c9 = hs->field_0x6c9 & 0xbf;
            }
            else if (local_2f8.data_._0_2_ != *(undefined2 *)(p_Var5 + 0xd0)) {
              iVar25 = 0xf6;
              in_R8 = (SSL_SESSION *)0x266;
              goto LAB_001474d0;
            }
            if (((hs->field_0x6c9 & 8) == 0) ||
               (*(uint16_t *)(pSVar39->handshake_func + 0xd0) ==
                ((hs->early_session)._M_t.
                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version)) {
              uVar19 = ssl_protocol_version((SSL *)pSVar39);
              if (uVar19 < 0x304) {
                if ((hs->pake_prover)._M_t.
                    super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                    (Prover *)0x0) {
                  std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_60
                             ,(pointer)0x0);
                  std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)
                             local_68._M_head_impl,(pointer)0x0);
                  ssl_done_writing_client_hello(hs);
                  if ((hs->selected_ech_config)._M_t.
                      super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl !=
                      (ECHConfig *)0x0) {
                    *(undefined4 *)(pSVar39->handshake_func + 0xd8) = 2;
                  }
                  p_Var5 = pSVar39->handshake_func;
                  uVar10 = *(undefined8 *)local_178._24_8_;
                  uVar11 = *(undefined8 *)(local_178._24_8_ + 8);
                  uVar12 = *(undefined8 *)(local_178._24_8_ + 0x18);
                  *(undefined8 *)(p_Var5 + 0x20) = *(undefined8 *)(local_178._24_8_ + 0x10);
                  *(undefined8 *)(p_Var5 + 0x28) = uVar12;
                  *(undefined8 *)(p_Var5 + 0x10) = uVar10;
                  *(undefined8 *)(p_Var5 + 0x18) = uVar11;
                  p_Var5 = pSVar39->handshake_func;
                  if (((((byte)p_Var5[0xdc] & 0x10) == 0) && (0x303 < hs->max_version)) &&
                     ((*(char (*) [8])(p_Var5 + 0x28) == (char  [8])0x4452474e574f44 ||
                      ((*(long *)(p_Var5 + 0x28) == 0x14452474e574f44 ||
                       (*(long *)(p_Var5 + 0x28) == -0xefb83d574b4013)))))) {
                    iVar25 = 0x129;
                    in_R8 = (SSL_SESSION *)0x2b9;
                    goto LAB_0014841a;
                  }
                  pSVar35 = SSL_get_cipher_by_value(local_140);
                  p_Var9 = hs->config->psk_client_callback;
                  if (((pSVar35 == (SSL_CIPHER *)0x0) ||
                      ((pSVar35->algorithm_mkey &
                       (uint)(p_Var9 ==
                             (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) << 2
                       ) != 0)) ||
                     ((pSVar35->algorithm_auth &
                      (uint)(p_Var9 ==
                            (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) << 3)
                      != 0)) {
LAB_001483fe:
                    iVar25 = 0xf2;
                    in_R8 = (SSL_SESSION *)0x2c9;
                  }
                  else {
                    uVar19 = SSL_CIPHER_get_min_version(pSVar35);
                    uVar20 = ssl_protocol_version((SSL *)pSVar39);
                    if (uVar20 < uVar19) goto LAB_001483fe;
                    uVar19 = SSL_CIPHER_get_max_version(pSVar35);
                    uVar20 = ssl_protocol_version((SSL *)pSVar39);
                    if (uVar19 < uVar20) goto LAB_001483fe;
                    sk = (OPENSSL_STACK *)SSL_get_ciphers(pSVar39);
                    iVar25 = OPENSSL_sk_find(sk,(size_t *)0x0,pSVar35,sk_SSL_CIPHER_call_cmp_func);
                    if (iVar25 == 0) goto LAB_001483fe;
                    hs->new_cipher = pSVar35;
                    uVar34 = (ulong)(hs->session_id).size_;
                    if (((uVar34 == 0) || (local_148 != uVar34)) ||
                       ((local_148 != 0 &&
                        (iVar25 = bcmp((void *)local_178._40_8_,local_230,local_148), iVar25 != 0)))
                       ) {
                      ssl_set_session((SSL *)pSVar39,(SSL_SESSION *)0x0);
                      bVar15 = ssl_get_new_session(hs);
                      sVar14 = local_148;
                      if (!bVar15) goto LAB_00148581;
                      if (0x20 < local_148) {
LAB_00148bba:
                        abort();
                      }
                      psVar4 = (hs->new_session)._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                      (psVar4->session_id).size_ = '\0';
                      if (local_148 != 0) {
                        memmove(&psVar4->session_id,(void *)local_178._40_8_,local_148);
                      }
                      (psVar4->session_id).size_ = (PackedSize<32UL>)sVar14;
                      ((hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher =
                           hs->new_cipher;
LAB_00148375:
                      uVar19 = ssl_protocol_version((SSL *)pSVar39);
                      bVar15 = SSLTranscript::InitHash
                                         ((SSLTranscript *)local_2a8,uVar19,hs->new_cipher);
                      if ((!bVar15) ||
                         (bVar15 = ssl_hash_message(hs,(SSLMessage *)local_218), !bVar15))
                      goto LAB_00148581;
                      if ((pSVar39->init_msg != (void *)0x0) ||
                         (bVar15 = ssl_cipher_uses_certificate_auth(hs->new_cipher), !bVar15)) {
                        SSLTranscript::FreeBuffer((SSLTranscript *)local_2a8);
                      }
                      if (local_13e == '\0') {
                        bVar15 = ssl_parse_serverhello_tlsext(hs,local_138);
                        if (!bVar15) {
                          iVar25 = 0xbe;
                          in_R8 = (SSL_SESSION *)0x319;
                          goto LAB_0014623f;
                        }
                        if ((pSVar39->init_msg == (void *)0x0) ||
                           (bVar1 = *(byte *)((long)pSVar39->init_msg + 0x1b8),
                           (*(uint *)&hs->field_0x6c8 >> 0x11 & 1) == (bVar1 & 1))) {
                          (**(code **)(*(long *)pSVar39 + 0x20))(pSVar39);
                          if (pSVar39->init_msg == (void *)0x0) {
                            hs->state = 5;
                          }
                          else if ((pSVar39->packet[0x178] == '\x01') &&
                                  (bVar15 = ssl_cipher_uses_certificate_auth(hs->new_cipher), bVar15
                                  )) {
                            hs->state = 8;
                          }
                          else {
                            hs->state = 0x11;
                          }
                          goto LAB_0014876b;
                        }
                        if ((bVar1 & 1) == 0) {
                          iVar25 = 0xcd;
                          in_R8 = (SSL_SESSION *)0x322;
                        }
                        else {
                          iVar25 = 0xcc;
                          in_R8 = (SSL_SESSION *)0x320;
                        }
                        ERR_put_error(0x10,0,iVar25,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                      ,(int)in_R8);
                        uVar28 = 0x28;
                        goto LAB_001472a1;
                      }
                      iVar25 = 0xee;
                      in_R8 = (SSL_SESSION *)0x313;
                    }
                    else {
                      pSVar38 = (SSL_SESSION *)pSVar39->init_msg;
                      if ((pSVar38 == (SSL_SESSION *)0x0) ||
                         (*(int *)(pSVar39->handshake_func + 0xd8) == 2)) {
                        iVar25 = 0x11e;
                        in_R8 = (SSL_SESSION *)0x2da;
                      }
                      else if (pSVar38->ssl_version == *(uint16_t *)(pSVar39->handshake_func + 0xd0)
                              ) {
                        if (pSVar38->cipher == pSVar35) {
                          bVar15 = ssl_session_is_context_valid(hs,pSVar38);
                          if (bVar15) {
                            uVar36 = *(ushort *)(pSVar39->handshake_func + 0xdc);
                            if ((uVar36 & 0x10) != 0) {
                              __assert_fail("!ssl->s3->initial_handshake_complete",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                            ,0x2f0,
                                            "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)"
                                           );
                            }
                            *(ushort *)(pSVar39->handshake_func + 0xdc) = uVar36 | 0x20;
                            goto LAB_00148375;
                          }
                          iVar25 = 0x65;
                          in_R8 = (SSL_SESSION *)0x2eb;
                        }
                        else {
                          iVar25 = 0xbb;
                          in_R8 = (SSL_SESSION *)0x2e4;
                        }
                      }
                      else {
                        iVar25 = 0xbc;
                        in_R8 = (SSL_SESSION *)0x2df;
                      }
                    }
                  }
LAB_0014841a:
                  ERR_put_error(0x10,0,iVar25,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,(int)in_R8);
                  iVar25 = 0x2f;
                  goto LAB_001474e2;
                }
                iVar25 = 0xf0;
                in_R8 = (SSL_SESSION *)0x299;
              }
              else {
                if ((hs->field_0x6cb & 2) == 0) {
                  hs->state = 4;
                  goto LAB_0014876b;
                }
                iVar25 = 0x9f;
                in_R8 = (SSL_SESSION *)0x28d;
              }
            }
            else {
              uVar19 = ssl_protocol_version((SSL *)pSVar39);
              if (0x303 < uVar19) {
                __assert_fail("ssl_protocol_version(ssl) < TLS1_3_VERSION",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x272,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              uVar19 = ssl_session_protocol_version
                                 ((hs->early_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
              if (uVar19 < 0x304) {
                __assert_fail("ssl_session_protocol_version(hs->early_session.get()) >= TLS1_3_VERSION"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x274,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              iVar25 = SSL_is_dtls((SSL *)pSVar39);
              if (iVar25 != 0) {
                __assert_fail("!SSL_is_dtls(ssl)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x284,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              hs->field_0x6c9 = hs->field_0x6c9 & 0xdf;
              iVar25 = 0x116;
              in_R8 = (SSL_SESSION *)0x286;
            }
          }
          else {
            iVar25 = 0xf0;
            in_R8 = (SSL_SESSION *)0x258;
          }
LAB_001474d0:
          ERR_put_error(0x10,0,iVar25,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          iVar25 = 0x46;
LAB_001474e2:
          sVar24 = ssl_hs_error;
          ssl_send_alert((SSL *)pSVar39,2,iVar25);
        }
        else {
          pSVar39 = (SSL *)hs->ssl;
          iVar25 = SSL_is_dtls((SSL *)pSVar39);
          if (iVar25 == 0) {
            __assert_fail("SSL_is_dtls(ssl)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x1ff,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          if (local_218[1] != '\x03') {
            __assert_fail("msg.type == DTLS1_MT_HELLO_VERIFY_REQUEST",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x200,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          if ((hs->field_0x6cb & 2) != 0) {
            __assert_fail("!hs->received_hello_verify_request",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x201,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          local_178._0_8_ = local_218._8_8_;
          local_178._8_8_ = local_218._16_8_;
          iVar25 = CBS_get_u16((CBS *)local_178,(uint16_t *)local_298);
          if (((iVar25 == 0) ||
              (iVar25 = CBS_get_u8_length_prefixed((CBS *)local_178,(CBS *)local_2d8),
              uVar10 = auStack_2d0._0_8_, auVar13 = local_2d8, iVar25 == 0)) ||
             ((SSL_CONFIG *)local_178._8_8_ != (SSL_CONFIG *)0x0)) {
            in_R8 = (SSL_SESSION *)0x208;
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x208);
            uVar28 = 0x32;
LAB_001472a1:
            ssl_send_alert((SSL *)pSVar39,2,uVar28);
          }
          else {
            bVar15 = Array<unsigned_char>::InitUninitialized
                               ((Array<unsigned_char> *)local_188._M_head_impl,auStack_2d0._0_8_);
            if ((_Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>)uVar10 !=
                (SSL_CONFIG *)0x0 && bVar15) {
              memmove(*(void **)local_188._M_head_impl,(void *)auVar13,uVar10);
            }
            uVar28 = 0x50;
            if (!bVar15) goto LAB_001472a1;
            hs->field_0x6cb = hs->field_0x6cb | 2;
            (**(code **)(*(long *)pSVar39 + 0x20))(pSVar39);
            bVar15 = SSLTranscript::Init((SSLTranscript *)local_2a8);
            if (bVar15) {
              bVar15 = ssl_add_client_hello(hs);
              sVar24 = ssl_hs_error;
              if (bVar15) {
                hs->field_0x6cb = hs->field_0x6cb | 2;
                hs->state = 3;
                sVar24 = ssl_hs_flush;
              }
              break;
            }
          }
LAB_001472a6:
          sVar24 = ssl_hs_error;
        }
      }
      break;
    case 4:
      sVar24 = tls13_client_handshake(hs);
      if (sVar24 == ssl_hs_ok) {
LAB_001465a3:
        hs->state = 0x14;
        goto LAB_001466e3;
      }
      break;
    case 5:
      pSVar40 = hs->ssl;
      bVar15 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (!bVar15) {
LAB_0014638f:
        hs->state = 6;
        goto LAB_001466e3;
      }
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)local_178);
      sVar24 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)local_178,0xb);
        sVar24 = ssl_hs_error;
        if ((bVar15) && (bVar15 = ssl_hash_message(hs,(SSLMessage *)local_178), bVar15)) {
          local_218._8_8_ = CONCAT62(local_178._18_6_,local_178._16_2_);
          local_218._0_8_ = local_178._8_8_;
          local_2d8[0] = 0x32;
          in_R9 = (SSL_SESSION *)
                  ((pSVar40->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool;
          in_R8 = (SSL_SESSION *)local_218;
          bVar15 = ssl_parse_cert_chain
                             (local_2d8,
                              &((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs,
                              local_50,(uint8_t *)0x0,(CBS *)in_R8,(CRYPTO_BUFFER_POOL *)in_R9);
          if (bVar15) {
            sVar31 = OPENSSL_sk_num((OPENSSL_STACK *)
                                    (((hs->new_session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                    ->certs)._M_t.
                                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                   );
            if (((sVar31 == 0) || ((pointer)local_218._8_8_ != (pointer)0x0)) ||
               (bVar15 = (*((pSVar40->ctx)._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                           session_cache_objects)
                                   ((hs->new_session)._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl),
               !bVar15)) {
              in_R8 = (SSL_SESSION *)0x35f;
LAB_00147c46:
              sVar24 = ssl_hs_error;
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,(int)in_R8);
              ssl_send_alert(pSVar40,2,0x32);
              break;
            }
            pkey = (hs->peer_pubkey)._M_t.
                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
            pCVar30 = (CRYPTO_BUFFER *)
                      OPENSSL_sk_value((OPENSSL_STACK *)
                                       (((hs->new_session)._M_t.
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                        _M_head_impl)->certs)._M_t.
                                       super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                       ,0);
            bVar15 = ssl_check_leaf_certificate(hs,pkey,pCVar30);
            if (bVar15) {
              (*pSVar40->method->next_message)(pSVar40);
              goto LAB_0014638f;
            }
            uVar28 = 0x2f;
          }
          else {
            uVar28 = (uint)local_2d8[0];
          }
LAB_00147cf4:
          ssl_send_alert(pSVar40,2,uVar28);
LAB_00147cf9:
          sVar24 = ssl_hs_error;
        }
      }
      break;
    case 6:
      if ((hs->field_0x6c8 & 0x40) != 0) {
        pSVar40 = hs->ssl;
        bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)local_178);
        sVar24 = ssl_hs_read_message;
        if (!bVar15) break;
        if (local_178[1] == '\x16') {
          bVar15 = ssl_hash_message(hs,(SSLMessage *)local_178);
          sVar24 = ssl_hs_error;
          if (!bVar15) break;
          local_218._8_8_ = CONCAT62(local_178._18_6_,local_178._16_2_);
          local_218._0_8_ = local_178._8_8_;
          iVar25 = CBS_get_u8((CBS *)local_218,local_298);
          if ((((iVar25 == 0) || (local_298[0] != (bssl)0x1)) ||
              (iVar25 = CBS_get_u24_length_prefixed((CBS *)local_218,(CBS *)local_2d8), iVar25 == 0)
              ) || (((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0 ||
                    ((pointer)local_218._8_8_ != (pointer)0x0)))) {
            in_R8 = (SSL_SESSION *)0x390;
            goto LAB_00147c46;
          }
          psVar4 = (hs->new_session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          pCVar30 = CRYPTO_BUFFER_new_from_CBS
                              ((CBS *)local_2d8,
                               ((pSVar40->ctx)._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool);
          std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                     &psVar4->ocsp_response,pCVar30);
          if ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
              *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
               &(((hs->new_session)._M_t.
                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ocsp_response)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> ==
              (crypto_buffer_st *)0x0) {
LAB_00147ce7:
            uVar28 = 0x50;
            goto LAB_00147cf4;
          }
          (*pSVar40->method->next_message)(pSVar40);
        }
      }
      hs->state = 7;
LAB_001466e3:
      sVar24 = ssl_hs_ok;
      break;
    case 7:
      bVar15 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (bVar15) {
        sVar23 = ssl_verify_peer_cert(hs);
        sVar24 = ssl_hs_error;
        if (sVar23 == ssl_verify_invalid) break;
        if (sVar23 == ssl_verify_retry) {
          hs->state = 7;
          goto LAB_00146557;
        }
      }
      hs->state = 9;
LAB_00146c2e:
      sVar24 = ssl_hs_ok;
      break;
    case 8:
      if (((hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == false) {
        __assert_fail("hs->ssl->ctx->reverify_on_resume",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                      ,0x3b7,
                      "enum ssl_hs_wait_t bssl::do_reverify_server_certificate(SSL_HANDSHAKE *)");
      }
      sVar23 = ssl_reverify_peer_cert(hs,true);
      sVar24 = ssl_hs_error;
      if (sVar23 != ssl_verify_invalid) {
        if (sVar23 != ssl_verify_retry) {
          hs->state = 0x11;
          goto LAB_00146c2e;
        }
        hs->state = 8;
LAB_00146557:
        sVar24 = ssl_hs_certificate_verify;
      }
      break;
    case 9:
      pSVar39 = (SSL *)hs->ssl;
      cVar17 = (**(code **)(*(long *)pSVar39 + 0x18))(pSVar39);
      sVar24 = ssl_hs_read_message;
      if (cVar17 != '\0') {
        if (local_218[1] != '\f') {
          bVar15 = ssl_cipher_requires_server_key_exchange(hs->new_cipher);
          if (!bVar15) {
LAB_00148764:
            hs->state = 10;
            goto LAB_0014876b;
          }
          in_R8 = (SSL_SESSION *)0x3d1;
LAB_00146caf:
          ERR_put_error(0x10,0,0xdf,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          iVar25 = 10;
          goto LAB_001474e2;
        }
        bVar15 = ssl_hash_message(hs,(SSLMessage *)local_218);
        sVar24 = ssl_hs_error;
        if (bVar15) {
          uVar28 = hs->new_cipher->algorithm_mkey;
          uVar27 = hs->new_cipher->algorithm_auth;
          local_2d8 = (undefined1  [8])local_218._8_8_;
          auStack_2d0._0_8_ = local_218._16_8_;
          if ((uVar27 & 8) == 0) {
LAB_00145efb:
            if ((uVar28 & 2) == 0) {
              if ((uVar28 & 4) == 0) {
                in_R8 = (SSL_SESSION *)0x423;
                goto LAB_00146caf;
              }
            }
            else {
              iVar25 = CBS_get_u8((CBS *)local_2d8,local_268);
              if ((((iVar25 == 0) || (local_268[0] != '\x03')) ||
                  (iVar25 = CBS_get_u16((CBS *)local_2d8,(uint16_t *)local_298), iVar25 == 0)) ||
                 (iVar25 = CBS_get_u8_length_prefixed((CBS *)local_2d8,(CBS *)local_178),
                 iVar25 == 0)) {
                in_R8 = (SSL_SESSION *)0x411;
                goto LAB_00147c1b;
              }
              bVar15 = tls1_check_group_id(hs,CONCAT11(local_298[1],local_298[0]));
              uVar11 = local_178._8_8_;
              uVar10 = local_178._0_8_;
              if (!bVar15) {
                in_R8 = (SSL_SESSION *)0x418;
                ERR_put_error(0x10,0,0xf3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x418);
                uVar28 = 0x2f;
                goto LAB_001472a1;
              }
              ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id =
                   CONCAT11(local_298[1],local_298[0]);
              bVar15 = Array<unsigned_char>::InitUninitialized(local_238,local_178._8_8_);
              if ((SSL_CONFIG *)uVar11 != (SSL_CONFIG *)0x0 && bVar15) {
                memmove(local_238->data_,(void *)uVar10,uVar11);
              }
              sVar24 = ssl_hs_error;
              if (!bVar15) break;
            }
            uVar10 = local_218._8_8_;
            sVar31 = local_218._16_8_ - auStack_2d0._0_8_;
            bVar15 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
            if (bVar15) {
              local_2e8.data._0_1_ = 0;
              local_2e8.data._1_1_ = 0;
              uVar19 = ssl_protocol_version((SSL *)pSVar39);
              if (uVar19 < 0x303) {
                bVar15 = tls1_get_legacy_signature_algorithm
                                   ((uint16_t *)&local_2e8,
                                    (hs->peer_pubkey)._M_t.
                                    super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
                if (!bVar15) {
                  in_R8 = (SSL_SESSION *)0x441;
                  ERR_put_error(0x10,0,0xc1,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x441);
                  uVar28 = 0x2b;
                  goto LAB_001472a1;
                }
              }
              else {
                iVar25 = CBS_get_u16((CBS *)local_2d8,(uint16_t *)&local_2e8);
                if (iVar25 == 0) {
                  in_R8 = (SSL_SESSION *)0x434;
                  goto LAB_00147c1b;
                }
                local_178[0] = (bssl)0x32;
                bVar15 = tls12_check_peer_sigalg
                                   (hs,local_178,CONCAT11(local_2e8.data._1_1_,(byte)local_2e8.data)
                                    ,(hs->peer_pubkey)._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
                if (!bVar15) {
                  ssl_send_alert((SSL *)pSVar39,2,(uint)(byte)local_178[0]);
                  goto LAB_001472a6;
                }
                ((hs->new_session)._M_t.
                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                peer_signature_algorithm = CONCAT11(local_2e8.data._1_1_,(byte)local_2e8.data);
              }
              iVar25 = CBS_get_u16_length_prefixed((CBS *)local_2d8,(CBS *)local_298);
              if ((iVar25 != 0) &&
                 ((__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>)auStack_2d0._0_8_ ==
                  (__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>)0x0)) {
                CBB_zero((CBB *)local_178);
                local_268 = (undefined1  [8])0x0;
                CStack_260.sk = (stack_st_void *)0x0;
                iVar25 = CBB_init((CBB *)local_178,sVar31 + 0x40);
                if ((((iVar25 == 0) ||
                     ((iVar25 = CBB_add_bytes((CBB *)local_178,
                                              ((SSL3_STATE *)pSVar39->handshake_func)->client_random
                                              ,0x20), iVar25 == 0 ||
                      (iVar25 = CBB_add_bytes((CBB *)local_178,
                                              ((SSL3_STATE *)pSVar39->handshake_func)->server_random
                                              ,0x20), iVar25 == 0)))) ||
                    (iVar25 = CBB_add_bytes((CBB *)local_178,(uint8_t *)uVar10,sVar31), iVar25 == 0)
                    ) || (bVar15 = CBBFinishArray((CBB *)local_178,(Array<unsigned_char> *)local_268
                                                 ), !bVar15)) {
                  iVar25 = 0x50;
                  in_R8 = (SSL_SESSION *)0x45a;
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x45a);
                }
                else {
                  signature.data_._1_1_ = local_298[1];
                  signature.data_._0_1_ = local_298[0];
                  signature.data_._2_6_ = local_298._2_6_;
                  signature.size_ = local_298._8_8_;
                  in_R8 = (SSL_SESSION *)
                          (hs->peer_pubkey)._M_t.
                          super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
                  local_2f8.data_._0_2_ = local_268._0_2_;
                  local_2f8.data_._2_6_ = local_268._2_6_;
                  local_2f8.size_ = (size_t)CStack_260.sk;
                  in_stack_fffffffffffffce8 = local_268._0_4_;
                  in_stack_fffffffffffffcec = local_268._4_4_;
                  in_00.size_ = (size_t)CStack_260.sk;
                  in_00.data_ = (uchar *)local_268;
                  in_stack_fffffffffffffcf0.sk = CStack_260.sk;
                  bVar15 = ssl_public_key_verify
                                     ((SSL *)pSVar39,signature,
                                      CONCAT11(local_2e8.data._1_1_,(byte)local_2e8.data),
                                      (EVP_PKEY *)in_R8,in_00);
                  if (bVar15) {
                    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_268);
                    CBB_cleanup((CBB *)local_178);
                    goto LAB_0014875a;
                  }
                  iVar25 = 0x33;
                  in_R8 = (SSL_SESSION *)0x462;
                  ERR_put_error(0x10,0,0x72,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x462);
                }
                ssl_send_alert((SSL *)pSVar39,2,iVar25);
                Array<unsigned_char>::~Array((Array<unsigned_char> *)local_268);
                CBB_cleanup((CBB *)local_178);
                goto LAB_001472a6;
              }
              iVar25 = 0x89;
              in_R8 = (SSL_SESSION *)0x44a;
            }
            else {
              if (uVar27 != 8) {
                __assert_fail("alg_a == SSL_aPSK",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x468,
                              "enum ssl_hs_wait_t bssl::do_read_server_key_exchange(SSL_HANDSHAKE *)"
                             );
              }
              if ((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0) {
LAB_0014875a:
                (**(code **)(*(long *)pSVar39 + 0x20))(pSVar39);
                goto LAB_00148764;
              }
              iVar25 = 0x97;
              in_R8 = (SSL_SESSION *)0x46b;
            }
            ERR_put_error(0x10,0,iVar25,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
            iVar25 = 0x32;
            goto LAB_001474e2;
          }
          iVar25 = CBS_get_u16_length_prefixed((CBS *)local_2d8,(CBS *)local_178);
          if (iVar25 == 0) {
            in_R8 = (SSL_SESSION *)0x3e7;
LAB_00147c1b:
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
            uVar28 = 0x32;
            goto LAB_001472a1;
          }
          if (((SSL_CONFIG *)0x80 < (ulong)local_178._8_8_) ||
             (iVar25 = CBS_contains_zero_byte((CBS *)local_178), iVar25 != 0)) {
            in_R8 = (SSL_SESSION *)0x3f5;
            ERR_put_error(0x10,0,0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x3f5);
            uVar28 = 0x28;
            goto LAB_001472a1;
          }
          local_298[0] = (bssl)0x0;
          local_298[1] = '\0';
          local_298._2_6_ = 0;
          if (((SSL_CONFIG *)local_178._8_8_ == (SSL_CONFIG *)0x0) ||
             (iVar25 = CBS_strdup((CBS *)local_178,(char **)local_298), iVar25 != 0)) {
            std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)local_70._M_head_impl,
                       (pointer)CONCAT62(local_298._2_6_,CONCAT11(local_298[1],local_298[0])));
            goto LAB_00145efb;
          }
LAB_00148581:
          uVar28 = 0x50;
          goto LAB_001472a1;
        }
      }
      break;
    case 10:
      pSVar40 = hs->ssl;
      bVar15 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (!bVar15) {
LAB_00146508:
        hs->state = 0xb;
        goto LAB_001466e3;
      }
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)local_178);
      sVar24 = ssl_hs_read_message;
      if (bVar15) {
        if (local_178[1] == '\x0e') {
          SSLTranscript::FreeBuffer((SSLTranscript *)local_2a8);
          goto LAB_00146508;
        }
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)local_178,0xd);
        sVar24 = ssl_hs_error;
        if ((bVar15) && (bVar15 = ssl_hash_message(hs,(SSLMessage *)local_178), bVar15)) {
          local_218._8_8_ = CONCAT62(local_178._18_6_,local_178._16_2_);
          local_218._0_8_ = local_178._8_8_;
          iVar25 = CBS_get_u8_length_prefixed((CBS *)local_218,(CBS *)local_2d8);
          uVar10 = auStack_2d0._0_8_;
          auVar13 = local_2d8;
          if (iVar25 == 0) {
            ssl_send_alert(pSVar40,2,0x32);
            iVar25 = 0x89;
            in_R8 = (SSL_SESSION *)0x494;
          }
          else {
            bVar15 = Array<unsigned_char>::InitUninitialized(local_190,auStack_2d0._0_8_);
            if ((SSL_CONFIG *)uVar10 != (SSL_CONFIG *)0x0 && bVar15) {
              memmove(local_190->data_,(void *)auVar13,uVar10);
            }
            if (!bVar15) goto LAB_00147ce7;
            uVar19 = ssl_protocol_version(pSVar40);
            if ((uVar19 < 0x303) ||
               ((iVar25 = CBS_get_u16_length_prefixed((CBS *)local_218,(CBS *)local_298),
                iVar25 != 0 && (bVar15 = tls1_parse_peer_sigalgs(hs,(CBS *)local_298), bVar15)))) {
              local_268[0] = 0x32;
              SSL_parse_CA_list((bssl *)local_298,pSVar40,local_268,(CBS *)local_218);
              __p_00 = (pointer)CONCAT62(local_298._2_6_,CONCAT11(local_298[1],local_298[0]));
              if (__p_00 == (pointer)0x0) {
                sVar24 = ssl_hs_error;
                ssl_send_alert(pSVar40,2,(uint)local_268[0]);
              }
              else if ((pointer)local_218._8_8_ == (pointer)0x0) {
                hs->field_0x6c8 = hs->field_0x6c8 | 0x20;
                local_298[0] = (bssl)0x0;
                local_298[1] = '\0';
                local_298._2_6_ = 0;
                std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                           local_78,__p_00);
                (*((pSVar40->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                  hs_flush_cached_ca_names)(hs);
                (*pSVar40->method->next_message)(pSVar40);
                hs->state = 0xb;
                sVar24 = ssl_hs_ok;
              }
              else {
                ssl_send_alert(pSVar40,2,0x32);
                sVar24 = ssl_hs_error;
                in_R8 = (SSL_SESSION *)0x4b1;
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x4b1);
              }
              std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)local_298);
              break;
            }
            ssl_send_alert(pSVar40,2,0x32);
            iVar25 = 0x89;
            in_R8 = (SSL_SESSION *)0x4a2;
          }
LAB_00148532:
          ERR_put_error(0x10,0,iVar25,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          sVar24 = ssl_hs_error;
        }
      }
      break;
    case 0xb:
      pSVar40 = hs->ssl;
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)local_178);
      sVar24 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)local_178,0xe);
        sVar24 = ssl_hs_error;
        if ((bVar15) && (bVar15 = ssl_hash_message(hs,(SSLMessage *)local_178), bVar15)) {
          if (CONCAT62(local_178._18_6_,local_178._16_2_) == 0) {
            bVar15 = (*pSVar40->method->has_unprocessed_handshake_data)(pSVar40);
            if (!bVar15) {
              (*pSVar40->method->next_message)(pSVar40);
              hs->state = 0xc;
              goto LAB_001466e3;
            }
            ssl_send_alert(pSVar40,2,10);
            iVar25 = 0xff;
            in_R8 = (SSL_SESSION *)0x4d4;
          }
          else {
            ssl_send_alert(pSVar40,2,0x32);
            iVar25 = 0x89;
            in_R8 = (SSL_SESSION *)0x4cd;
          }
          goto LAB_00148532;
        }
      }
      break;
    case 0xc:
      if ((hs->field_0x6c8 & 0x20) == 0) {
        hs->state = 0xd;
        goto LAB_001466e3;
      }
      ssl = (DTLS1_STATE *)hs->ssl;
      if (*(int *)(*(long *)((tuple<bio_st_*,_bssl::internal::Deleter> *)
                             (ssl->read_epoch).bitmap.map_.super__Base_bitset<4UL>._M_w + 2) + 0xd8)
          == 2) {
        SSL_certs_clear((SSL *)ssl);
      }
      else {
        pCVar6 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
        p_Var7 = pCVar6->cert_cb;
        if (p_Var7 != (_func_int_SSL_ptr_void_ptr *)0x0) {
          iVar25 = (*p_Var7)((SSL *)ssl,pCVar6->cert_cb_arg);
          if (iVar25 == 0) {
            ssl_send_alert((SSL *)ssl,2,0x50);
            bVar15 = false;
            in_R8 = (SSL_SESSION *)0x512;
            ERR_put_error(0x10,0,0x7e,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x512);
            sVar24 = ssl_hs_error;
          }
          else {
            bVar15 = true;
            sVar24 = ssl_hs_error;
            if (iVar25 < 0) {
              hs->state = 0xc;
              sVar24 = ssl_hs_x509_lookup;
              bVar15 = false;
            }
          }
          if (!bVar15) break;
        }
      }
      local_178._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
      local_178._8_8_ = (SSL_CONFIG *)0x0;
      bVar15 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)local_178);
      sVar24 = ssl_hs_error;
      if (bVar15) {
        if ((SSL_CONFIG *)local_178._8_8_ == (SSL_CONFIG *)0x0) {
          SSLTranscript::FreeBuffer((SSLTranscript *)local_2a8);
        }
        else {
          local_2e8.len =
               (size_t)(((InplaceVector<unsigned_char,_64UL> *)(local_178._0_8_ + 10))->storage_ +
                       local_178._8_8_ * 8 + -10);
          psVar41 = (pointer)local_178._0_8_;
          local_2a0._M_head_impl = (ssl_ctx_st *)ssl;
LAB_0014757c:
          do {
            cred = *(SSL_CREDENTIAL **)psVar41;
            ERR_clear_error();
            if (cred->type == kX509) {
              iVar25 = EVP_PKEY_id((EVP_PKEY *)
                                   (cred->pubkey)._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (iVar25 == 6) {
                uVar16 = 1;
LAB_001475d9:
                local_218[0] = uVar16;
                puVar33 = (hs->certificate_types).data_;
                puVar33 = std::
                          __find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                                    (puVar33,puVar33 + (hs->certificate_types).size_,local_218);
                if (puVar33 != (hs->certificate_types).data_ + (hs->certificate_types).size_) {
                  bVar15 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)local_2d8);
                  if (bVar15) {
                    bVar15 = ssl_credential_matches_requested_issuers(hs,cred);
                  }
                  else {
                    bVar15 = false;
                  }
                  goto LAB_00147658;
                }
                in_R8 = (SSL_SESSION *)0x4f4;
              }
              else if ((iVar25 == 0x3b5) || (in_R8 = (SSL_SESSION *)0x4ef, iVar25 == 0x198)) {
                uVar16 = 0x40;
                goto LAB_001475d9;
              }
              bVar15 = false;
              ERR_put_error(0x10,0,0xe4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,(int)in_R8);
            }
            else {
              bVar15 = false;
              in_R8 = (SSL_SESSION *)0x4e0;
              ERR_put_error(0x10,0,0xe4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x4e0);
            }
LAB_00147658:
            if (bVar15 != false) {
              if (cred != (SSL_CREDENTIAL *)0x0) {
                SSL_CREDENTIAL_up_ref(cred);
              }
              local_218._0_8_ = (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
              std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                         local_180._M_head_impl,cred);
              std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)local_218);
              hs->signature_algorithm = local_2d8._0_2_;
              psVar41 = (pointer)&psVar41->peer_signature_algorithm;
              if (bVar15 != false || psVar41 == (pointer)local_2e8.len) break;
              goto LAB_0014757c;
            }
            psVar41 = (pointer)&psVar41->peer_signature_algorithm;
          } while (psVar41 != (pointer)local_2e8.len);
          ssl_01._M_head_impl = local_2a0._M_head_impl;
          if ((tuple<ssl_credential_st_*,_bssl::internal::Deleter>)
              *(tuple<ssl_credential_st_*,_bssl::internal::Deleter> *)local_180._M_head_impl ==
              (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0) {
            uVar34 = ERR_peek_error();
            if ((int)uVar34 == 0) {
              __assert_fail("ERR_peek_error() != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x531,
                            "enum ssl_hs_wait_t bssl::do_send_client_certificate(SSL_HANDSHAKE *)");
            }
            ssl_send_alert((SSL *)ssl_01._M_head_impl,2,0x28);
            goto LAB_0014771c;
          }
        }
        bVar15 = ssl_send_tls12_certificate(hs);
        if (bVar15) {
          hs->state = 0xd;
          sVar24 = ssl_hs_ok;
        }
      }
LAB_0014771c:
      OPENSSL_free((void *)local_178._0_8_);
      break;
    case 0xd:
      pSVar40 = hs->ssl;
      CBB_zero((CBB *)local_2d8);
      bVar15 = (*pSVar40->method->init_message)(pSVar40,(CBB *)local_2d8,(CBB *)local_298,'\x10');
      sVar24 = ssl_hs_error;
      if (bVar15) {
        local_2f8.data_._0_2_ = ssl_hs_error;
        local_2f8.data_._2_6_ = 0;
        local_2f8.size_ = 0;
        pSVar35 = hs->new_cipher;
        uVar28 = pSVar35->algorithm_mkey;
        uVar27 = pSVar35->algorithm_auth;
        bVar15 = ssl_cipher_uses_certificate_auth(pSVar35);
        if (bVar15) {
          pCVar30 = (CRYPTO_BUFFER *)
                    OPENSSL_sk_value((OPENSSL_STACK *)
                                     (((hs->new_session)._M_t.
                                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                     ->certs)._M_t.
                                     super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                     ,0);
          CRYPTO_BUFFER_init_CBS(pCVar30,(CBS *)local_178);
          bVar15 = ssl_cert_check_key_usage((CBS *)local_178,uVar28 * 2 & key_usage_encipherment);
          if (bVar15) goto LAB_00146436;
          if (((hs->config->field_0x10d & 0x10) == 0) &&
             (iVar25 = EVP_PKEY_id((EVP_PKEY *)
                                   (hs->peer_pubkey)._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl),
             iVar25 == 6)) {
            ERR_clear_error();
            puVar32 = &pSVar40->s3->field_0xdc;
            *(ushort *)puVar32 = *(ushort *)puVar32 | 0x2000;
            goto LAB_00146436;
          }
LAB_00147e84:
          sVar24 = ssl_hs_error;
        }
        else {
LAB_00146436:
          sVar31 = 0;
          if ((uVar27 & 8) == 0) {
LAB_00146443:
            uVar42 = (undefined4)sVar31;
            if ((uVar28 & 1) == 0) {
              if ((uVar28 & 2) != 0) {
                iVar25 = CBB_add_u8_length_prefixed((CBB *)local_298,(CBB *)local_218);
                if (iVar25 == 0) goto LAB_00147e84;
                local_2e8.len = CONCAT44(local_2e8.len._4_4_,uVar42);
                SSLKeyShare::Create((SSLKeyShare *)local_268,
                                    ((hs->new_session)._M_t.
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                    group_id);
                local_2e8.data._0_1_ = 0x32;
                if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)local_268 ==
                    (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
LAB_00147c62:
                  ssl_send_alert(pSVar40,2,(uint)(byte)local_2e8.data);
                }
                else {
                  in_R8 = (SSL_SESSION *)(hs->peer_key).data_;
                  in_R9 = (SSL_SESSION *)(hs->peer_key).size_;
                  cVar17 = (**(code **)(*(long *)local_268 + 0x20))
                                     (local_268,local_218,&local_2f8,&local_2e8);
                  if (cVar17 == '\0') goto LAB_00147c62;
                  iVar25 = CBB_flush((CBB *)local_298);
                  if (iVar25 != 0) {
                    OPENSSL_free(local_238->data_);
                    local_238->data_ = (uchar *)0x0;
                    local_238->size_ = 0;
                    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_268);
                    goto LAB_00147b67;
                  }
                }
                std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_268);
                goto LAB_00147e84;
              }
              if ((uVar28 & 4) == 0) {
                ssl_send_alert(pSVar40,2,0x28);
                in_R8 = (SSL_SESSION *)0x5c2;
                iVar25 = 0x44;
                goto LAB_001473c0;
              }
              local_2e8.len = CONCAT44(local_2e8.len._4_4_,uVar42);
              bVar15 = Array<unsigned_char>::Init(&local_2f8,sVar31);
              if (!bVar15) goto LAB_00147e84;
LAB_00147b67:
              if ((uVar27 & 8) != 0) {
                CBB_zero((CBB *)local_218);
                uVar34 = local_2e8.len & 0xffffffff;
                iVar25 = CBB_init((CBB *)local_218,
                                  (size_t)(((InplaceVector<unsigned_char,_64UL> *)
                                           (local_2f8.size_ + 10))->storage_ + (uVar34 - 6)));
                if ((((iVar25 == 0) ||
                     (iVar25 = CBB_add_u16_length_prefixed((CBB *)local_218,(CBB *)local_268),
                     iVar25 == 0)) ||
                    ((iVar25 = CBB_add_bytes((CBB *)local_268,
                                             (uint8_t *)
                                             CONCAT62(local_2f8.data_._2_6_,local_2f8.data_._0_2_),
                                             local_2f8.size_), iVar25 == 0 ||
                     ((iVar25 = CBB_add_u16_length_prefixed((CBB *)local_218,(CBB *)local_268),
                      iVar25 == 0 ||
                      (iVar25 = CBB_add_bytes((CBB *)local_268,local_178,uVar34), iVar25 == 0))))))
                   || (bVar15 = CBBFinishArray((CBB *)local_218,&local_2f8), !bVar15)) {
                  CBB_cleanup((CBB *)local_218);
                  goto LAB_00147e84;
                }
                CBB_cleanup((CBB *)local_218);
              }
              bVar15 = ssl_add_message_cbb(pSVar40,(CBB *)local_2d8);
              sVar24 = ssl_hs_error;
              if (bVar15) {
                psVar4 = (hs->new_session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                (psVar4->secret).size_ = '0';
                out.data_ = &psVar4->secret;
                premaster.data_._2_6_ = local_2f8.data_._2_6_;
                premaster.data_._0_2_ = local_2f8.data_._0_2_;
                premaster.size_ = local_2f8.size_;
                out.size_ = 0x30;
                in_R8 = (SSL_SESSION *)local_2f8.size_;
                bVar15 = tls1_generate_master_secret(hs,out,premaster);
                if (bVar15) {
                  psVar4 = (hs->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  psVar4->field_0x1b8 =
                       psVar4->field_0x1b8 & 0xfe | (byte)(*(uint *)&hs->field_0x6c8 >> 0x11) & 1;
                  hs->state = 0xe;
                  sVar24 = ssl_hs_ok;
                }
              }
            }
            else {
              local_2e8.len = CONCAT44(local_2e8.len._4_4_,uVar42);
              rsa = EVP_PKEY_get0_RSA((hs->peer_pubkey)._M_t.
                                      super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (rsa == (RSA *)0x0) {
                sVar24 = ssl_hs_error;
                in_R8 = (SSL_SESSION *)0x58e;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x58e);
              }
              else {
                OPENSSL_free((void *)CONCAT62(local_2f8.data_._2_6_,local_2f8.data_._0_2_));
                local_2f8.data_._0_2_ = 0;
                local_2f8.data_._2_6_ = 0;
                local_2f8.size_ = 0;
                puVar32 = (undefined1 *)OPENSSL_malloc(0x40);
                local_2f8.data_._0_2_ = SUB82(puVar32,0);
                local_2f8.data_._2_6_ = (int6)((ulong)puVar32 >> 0x10);
                sVar24 = ssl_hs_error;
                if (puVar32 != (undefined1 *)0x0) {
                  local_2f8.size_ = 0x40;
                  *puVar32 = *(undefined1 *)((long)&hs->client_version + 1);
                  puVar32[1] = (char)hs->client_version;
                  iVar25 = RAND_bytes(puVar32 + 2,0x3e);
                  if ((iVar25 != 0) &&
                     (iVar25 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_218),
                     iVar25 != 0)) {
                    uVar28 = RSA_size((RSA *)rsa);
                    iVar25 = CBB_reserve((CBB *)local_218,(uint8_t **)local_268,(ulong)uVar28);
                    if (iVar25 != 0) {
                      local_2a0._M_head_impl = (ssl_ctx_st *)local_268;
                      uVar28 = RSA_size((RSA *)rsa);
                      in_R8 = (SSL_SESSION *)CONCAT62(local_2f8.data_._2_6_,local_2f8.data_._0_2_);
                      in_stack_fffffffffffffce8 = 1;
                      in_R9 = (SSL_SESSION *)local_2f8.size_;
                      iVar25 = RSA_encrypt(rsa,(size_t *)&local_2e8,
                                           (uint8_t *)local_2a0._M_head_impl,(ulong)uVar28,
                                           (uint8_t *)in_R8,local_2f8.size_,1);
                      if (((iVar25 != 0) &&
                          (iVar25 = CBB_did_write((CBB *)local_218,
                                                  CONCAT62(local_2e8.data._2_6_,
                                                           CONCAT11(local_2e8.data._1_1_,
                                                                    (byte)local_2e8.data))),
                          iVar25 != 0)) && (iVar25 = CBB_flush((CBB *)local_298), iVar25 != 0))
                      goto LAB_00147b67;
                    }
                  }
                }
              }
            }
          }
          else {
            pSVar8 = hs->config;
            if (pSVar8->psk_client_callback !=
                (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) {
              local_2a0._M_head_impl._0_4_ = uVar27;
              memset(local_218,0,0x81);
              in_R8 = (SSL_SESSION *)local_178;
              in_R9 = (SSL_SESSION *)0x0;
              uVar27 = (*pSVar8->psk_client_callback)
                                 (pSVar40,(hs->peer_psk_identity_hint)._M_t.
                                          super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
                                          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_char_*,_false>._M_head_impl,
                                  local_218,0x81,(uint8_t *)in_R8,0x100);
              local_2e8.len = CONCAT44(local_2e8.len._4_4_,uVar27);
              if (uVar27 == 0) {
                in_R8 = (SSL_SESSION *)0x575;
                ERR_put_error(0x10,0,0xc3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x575);
                ssl_send_alert(pSVar40,2,0x28);
              }
              else {
                if (0x100 < uVar27) {
                  __assert_fail("psk_len <= PSK_MAX_PSK_LEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x579,
                                "enum ssl_hs_wait_t bssl::do_send_client_key_exchange(SSL_HANDSHAKE *)"
                               );
                }
                psVar4 = (hs->new_session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                __p_01 = OPENSSL_strdup(local_218);
                std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)&psVar4->psk_identity,
                           __p_01);
                if ((_Head_base<0UL,_char_*,_false>)
                    *(_Tuple_impl<0UL,_char_*,_bssl::internal::Deleter> *)
                     &(((hs->new_session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->psk_identity).
                      _M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter> != (char *)0x0) {
                  iVar25 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_268);
                  uVar27 = (uint)local_2a0._M_head_impl;
                  if (iVar25 != 0) {
                    sVar31 = OPENSSL_strnlen(local_218,0x81);
                    iVar25 = CBB_add_bytes((CBB *)local_268,local_218,sVar31);
                    if (iVar25 != 0) {
                      iVar25 = CBB_flush((CBB *)local_298);
                      sVar31 = local_2e8.len & 0xffffffff;
                      if (iVar25 != 0) goto LAB_00146443;
                    }
                  }
                }
              }
              goto LAB_00147e84;
            }
            in_R8 = (SSL_SESSION *)0x56b;
            iVar25 = 0xc4;
LAB_001473c0:
            sVar24 = ssl_hs_error;
            ERR_put_error(0x10,0,iVar25,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
          }
        }
        OPENSSL_free((void *)CONCAT62(local_2f8.data_._2_6_,local_2f8.data_._0_2_));
      }
      CBB_cleanup((CBB *)local_2d8);
      break;
    case 0xe:
      if (((hs->field_0x6c8 & 0x20) == 0) ||
         ((hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl == (ssl_credential_st *)0x0
         )) {
        hs->state = 0xf;
LAB_00146595:
        sVar24 = ssl_hs_ok;
      }
      else {
        pSVar40 = hs->ssl;
        CBB_zero((CBB *)local_178);
        bVar15 = (*pSVar40->method->init_message)(pSVar40,(CBB *)local_178,(CBB *)local_218,'\x0f');
        sVar24 = ssl_hs_error;
        if (bVar15) {
          if (hs->signature_algorithm == 0) {
            __assert_fail("hs->signature_algorithm != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x5f4,
                          "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)"
                         );
          }
          uVar19 = ssl_protocol_version(pSVar40);
          if ((uVar19 < 0x303) ||
             (iVar25 = CBB_add_u16((CBB *)local_218,hs->signature_algorithm), iVar25 != 0)) {
            iVar25 = EVP_PKEY_size((EVP_PKEY *)
                                   (((hs->credential)._M_t.
                                     super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl
                                    )->pubkey)._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>);
            iVar21 = CBB_add_u16_length_prefixed((CBB *)local_218,(CBB *)local_2d8);
            sVar24 = ssl_hs_error;
            if (iVar21 != 0) {
              iVar21 = CBB_reserve((CBB *)local_2d8,(uint8_t **)local_268,(long)iVar25);
              if (iVar21 != 0) {
                local_2f8.data_._0_2_ = (undefined2)iVar25;
                local_2f8.data_._2_6_ = (int6)(short)((uint)iVar25 >> 0x10);
                in_R8 = (SSL_SESSION *)(ulong)hs->signature_algorithm;
                _Var3._M_head_impl =
                     (hs->transcript).buffer_._M_t.
                     super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
                in_stack_fffffffffffffcf0.sk = (stack_st_void *)(_Var3._M_head_impl)->length;
                puVar33 = (uchar *)(_Var3._M_head_impl)->data;
                local_298[0] = SUB81(puVar33,0);
                local_298[1] = (char)((ulong)puVar33 >> 8);
                local_298._2_6_ = (undefined6)((ulong)puVar33 >> 0x10);
                in_stack_fffffffffffffce8 = SUB84(puVar33,0);
                in_stack_fffffffffffffcec = (undefined4)((ulong)puVar33 >> 0x20);
                in.size_ = (size_t)in_stack_fffffffffffffcf0.sk;
                in.data_ = puVar33;
                local_298._8_8_ = in_stack_fffffffffffffcf0.sk;
                sVar22 = ssl_private_key_sign
                                   (hs,(uint8_t *)local_268,(size_t *)&local_2f8,(long)iVar25,
                                    hs->signature_algorithm,in);
                if (sVar22 == ssl_private_key_retry) {
                  sVar24 = ssl_hs_private_key_operation;
                  iVar25 = 0xe;
                }
                else {
                  sVar24 = ssl_hs_error;
                  if (((sVar22 == ssl_private_key_failure) ||
                      (iVar25 = CBB_did_write((CBB *)local_2d8,
                                              CONCAT62(local_2f8.data_._2_6_,local_2f8.data_._0_2_))
                      , sVar24 = ssl_hs_error, iVar25 == 0)) ||
                     (bVar15 = ssl_add_message_cbb(pSVar40,(CBB *)local_178), !bVar15))
                  goto LAB_00147cd5;
                  SSLTranscript::FreeBuffer((SSLTranscript *)local_2a8);
                  sVar24 = ssl_hs_ok;
                  iVar25 = 0xf;
                }
                hs->state = iVar25;
              }
            }
          }
          else {
            sVar24 = ssl_hs_error;
            in_R8 = (SSL_SESSION *)0x5f8;
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x5f8);
          }
        }
LAB_00147cd5:
        CBB_cleanup((CBB *)local_178);
      }
      break;
    case 0xf:
      pSVar40 = hs->ssl;
      hs->field_0x6ca = hs->field_0x6ca | 0x80;
      bVar15 = (*pSVar40->method->add_change_cipher_spec)(pSVar40);
      sVar24 = ssl_hs_error;
      if (bVar15) {
        bVar15 = tls1_change_cipher_state(hs,evp_aead_seal);
        sVar24 = ssl_hs_error;
        if (bVar15) {
          if ((hs->field_0x6c9 & 0x80) != 0) {
            sVar31 = (pSVar40->s3->next_proto_negotiated).size_;
            CBB_zero((CBB *)local_178);
            bVar15 = (*pSVar40->method->init_message)(pSVar40,(CBB *)local_178,(CBB *)local_218,'C')
            ;
            if (((((!bVar15) ||
                  (iVar25 = CBB_add_u8_length_prefixed((CBB *)local_218,(CBB *)local_2d8),
                  iVar25 == 0)) ||
                 (iVar25 = CBB_add_bytes((CBB *)local_2d8,(pSVar40->s3->next_proto_negotiated).data_
                                         ,(pSVar40->s3->next_proto_negotiated).size_), iVar25 == 0))
                || ((iVar25 = CBB_add_u8_length_prefixed((CBB *)local_218,(CBB *)local_2d8),
                    iVar25 == 0 ||
                    (iVar25 = CBB_add_bytes((CBB *)local_2d8,
                                            do_send_client_finished(bssl::SSL_HANDSHAKE*)::kZero,
                                            0x20 - (ulong)((int)sVar31 + 2U & 0x1f)), iVar25 == 0)))
                ) || (bVar15 = ssl_add_message_cbb(pSVar40,(CBB *)local_178), !bVar15)) {
              in_R8 = (SSL_SESSION *)0x634;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x634);
              CBB_cleanup((CBB *)local_178);
              goto LAB_00147cf9;
            }
            CBB_cleanup((CBB *)local_178);
          }
          if ((hs->field_0x6cb & 1) != 0) {
            CBB_zero((CBB *)local_178);
            bVar15 = (*pSVar40->method->init_message)
                               (pSVar40,(CBB *)local_178,(CBB *)local_218,0xcb);
            if (((!bVar15) || (bVar15 = tls1_write_channel_id(hs,(CBB *)local_218), !bVar15)) ||
               (bVar15 = ssl_add_message_cbb(pSVar40,(CBB *)local_178), !bVar15)) {
              in_R8 = (SSL_SESSION *)0x63f;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x63f);
              CBB_cleanup((CBB *)local_178);
              goto LAB_00147cf9;
            }
            CBB_cleanup((CBB *)local_178);
          }
          bVar15 = ssl_send_finished(hs);
          sVar24 = ssl_hs_error;
          if (bVar15) {
            hs->state = 0x10;
LAB_00145ff0:
            sVar24 = ssl_hs_flush;
          }
        }
      }
      break;
    case 0x10:
      pSVar40 = hs->ssl;
      if ((pSVar40->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl != (ssl_session_st *)0x0) {
        hs->state = 0x14;
        goto LAB_00146595;
      }
      bVar15 = tls1_record_handshake_hashes_for_channel_id(hs);
      sVar24 = ssl_hs_error;
      if (bVar15) {
        hs->state = 0x11;
        uVar26 = SSL_get_mode(pSVar40);
        sVar24 = ssl_hs_ok;
        if ((char)uVar26 < '\0') {
          pSVar39 = (SSL *)hs->ssl;
          iVar25 = SSL_is_dtls((SSL *)pSVar39);
          if (((((iVar25 == 0) && (iVar25 = SSL_version(pSVar39), iVar25 == 0x303)) &&
               (hs->new_cipher->algorithm_mkey == 2)) &&
              (((hs->new_cipher->algorithm_mac == 4 &&
                (p_Var5 = pSVar39->handshake_func, *(int *)(p_Var5 + 0xd8) != 2)) &&
               (((pSVar39->packet[0x289] & 1) != 0 ||
                ((*(long *)(p_Var5 + 0x220) != 0 || (*(long *)(p_Var5 + 0x210) != 0)))))))) &&
             (sVar24 = ssl_hs_ok, (pSVar40->s3->field_0xdc & 0x10) == 0)) {
            hs->field_0x6c9 = hs->field_0x6c9 | 0x22;
LAB_00146642:
            sVar24 = ssl_hs_early_return;
          }
        }
      }
      break;
    case 0x11:
      if ((hs->field_0x6ca & 1) == 0) {
LAB_001461de:
        hs->state = 0x12;
        sVar24 = ssl_hs_read_change_cipher_spec;
      }
      else {
        pSVar40 = hs->ssl;
        bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)local_178);
        sVar24 = ssl_hs_read_message;
        if (bVar15) {
          bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)local_178,4);
          sVar24 = ssl_hs_error;
          if ((bVar15) && (bVar15 = ssl_hash_message(hs,(SSLMessage *)local_178), bVar15)) {
            local_218._8_8_ = CONCAT62(local_178._18_6_,local_178._16_2_);
            local_218._0_8_ = local_178._8_8_;
            iVar25 = CBS_get_u32((CBS *)local_218,(uint32_t *)local_268);
            if ((iVar25 == 0) ||
               ((iVar25 = CBS_get_u16_length_prefixed((CBS *)local_218,(CBS *)local_2d8),
                this = local_228, iVar25 == 0 || ((pointer)local_218._8_8_ != (pointer)0x0)))) {
              ssl_send_alert(pSVar40,2,0x32);
              iVar25 = 0x89;
              in_R8 = (SSL_SESSION *)0x6a7;
              goto LAB_00148532;
            }
            if ((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0) {
              hs->field_0x6ca = hs->field_0x6ca & 0xfe;
            }
            else {
              pSVar38 = (pSVar40->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              if (pSVar38 != (SSL_SESSION *)0x0) {
                if ((local_228->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                    ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                    (ssl_session_st *)0x0) {
                  __assert_fail("!hs->new_session",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x6b9,
                                "enum ssl_hs_wait_t bssl::do_read_session_ticket(SSL_HANDSHAKE *)");
                }
                SSL_SESSION_dup((bssl *)local_298,pSVar38,2);
                psVar41 = (pointer)CONCAT62(local_298._2_6_,CONCAT11(local_298[1],local_298[0]));
                local_298[0] = (bssl)0x0;
                local_298[1] = '\0';
                local_298._2_6_ = 0;
                std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)this,psVar41)
                ;
                std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_298);
                if ((this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                    .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                    (ssl_session_st *)0x0) goto LAB_00147cf9;
              }
              ssl_session_rebase_time
                        (pSVar40,(hs->new_session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
              uVar10 = auStack_2d0._0_8_;
              auVar13 = local_2d8;
              this_00 = &((hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ticket;
              bVar15 = Array<unsigned_char>::InitUninitialized(this_00,auStack_2d0._0_8_);
              if ((__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>)uVar10 !=
                  (__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>)0x0 && bVar15) {
                memmove(this_00->data_,(void *)auVar13,uVar10);
              }
              if (!bVar15) goto LAB_00147cf9;
              psVar4 = (hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              psVar4->ticket_lifetime_hint = local_268._0_4_;
              (psVar4->session_id).size_ = ' ';
              SHA256((uchar *)local_2d8,auStack_2d0._0_8_,(uchar *)&psVar4->session_id);
            }
            (*pSVar40->method->next_message)(pSVar40);
            goto LAB_001461de;
          }
        }
      }
      break;
    case 0x12:
      bVar15 = tls1_change_cipher_state(hs,evp_aead_open);
      sVar24 = ssl_hs_error;
      if (bVar15) {
        hs->state = 0x13;
        goto LAB_001466e3;
      }
      break;
    case 0x13:
      pSVar40 = hs->ssl;
      sVar24 = ssl_get_finished(hs);
      if (sVar24 == ssl_hs_ok) {
        if ((pSVar40->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == (ssl_session_st *)0x0)
        goto LAB_001465a3;
        hs->state = 0xf;
        goto LAB_001466e3;
      }
      break;
    case 0x14:
      pSVar40 = hs->ssl;
      if (pSVar40->s3->ech_status == ssl_ech_rejected) {
        hs->field_0x6c8 = hs->field_0x6c8 | 2;
        ssl_send_alert(pSVar40,2,0x79);
        iVar25 = 0x13f;
        in_R8 = (SSL_SESSION *)0x6f3;
LAB_0014623f:
        sVar24 = ssl_hs_error;
        ERR_put_error(0x10,0,iVar25,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                      ,(int)in_R8);
      }
      else {
        (*pSVar40->method->on_handshake_complete)(pSVar40);
        pSVar38 = (local_228->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        if (pSVar38 == (SSL_SESSION *)0x0) {
          session_00 = (pSVar40->session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          if (session_00 == (SSL_SESSION *)0x0) {
            __assert_fail("ssl->session != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x70e,
                          "enum ssl_hs_wait_t bssl::do_finish_client_handshake(SSL_HANDSHAKE *)");
          }
          SSL_SESSION_up_ref(session_00);
          local_178._0_8_ = (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                     &pSVar40->s3->established_session,session_00);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_178);
        }
        else {
          SSL_SESSION_dup((bssl *)local_178,pSVar38,3);
          uVar10 = local_178._0_8_;
          local_178._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                     &pSVar40->s3->established_session,(pointer)uVar10);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_178);
          psVar4 = (pSVar40->s3->established_session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          sVar24 = ssl_hs_error;
          if (psVar4 == (ssl_session_st *)0x0) break;
          if ((pSVar40->s3->field_0xdc & 0x10) == 0) {
            puVar32 = &psVar4->field_0x1b8;
            *puVar32 = *puVar32 & 0xfb;
          }
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_228,
                     (pointer)0x0);
        }
        hs->field_0x6c8 = hs->field_0x6c8 | 8;
        puVar32 = &pSVar40->s3->field_0xdc;
        *(ushort *)puVar32 = *(ushort *)puVar32 | 0x10;
        if (pSVar38 != (SSL_SESSION *)0x0) {
          ssl_update_cache(pSVar40);
        }
        hs->state = 0x15;
LAB_0014876b:
        sVar24 = ssl_hs_ok;
      }
      break;
    case 0x15:
      ssl_do_info_callback(hs->ssl,0x20,1);
      return ssl_hs_ok;
    }
    if (hs->state != iVar2) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
    if (sVar24 != ssl_hs_ok) {
      return sVar24;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t ssl_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum ssl_client_hs_state_t state =
        static_cast<enum ssl_client_hs_state_t>(hs->state);
    switch (state) {
      case state_start_connect:
        ret = do_start_connect(hs);
        break;
      case state_enter_early_data:
        ret = do_enter_early_data(hs);
        break;
      case state_early_reverify_server_certificate:
        ret = do_early_reverify_server_certificate(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_tls13:
        ret = do_tls13(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_certificate_status:
        ret = do_read_certificate_status(hs);
        break;
      case state_verify_server_certificate:
        ret = do_verify_server_certificate(hs);
        break;
      case state_reverify_server_certificate:
        ret = do_reverify_server_certificate(hs);
        break;
      case state_read_server_key_exchange:
        ret = do_read_server_key_exchange(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_hello_done:
        ret = do_read_server_hello_done(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_key_exchange:
        ret = do_send_client_key_exchange(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_send_client_finished:
        ret = do_send_client_finished(hs);
        break;
      case state_finish_flight:
        ret = do_finish_flight(hs);
        break;
      case state_read_session_ticket:
        ret = do_read_session_ticket(hs);
        break;
      case state_process_change_cipher_spec:
        ret = do_process_change_cipher_spec(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_finish_client_handshake:
        ret = do_finish_client_handshake(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  ssl_do_info_callback(hs->ssl, SSL_CB_HANDSHAKE_DONE, 1);
  return ssl_hs_ok;
}